

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.cc
# Opt level: O3

long BIO_ctrl(BIO *bp,int cmd,long larg,void *parg)

{
  _func_599 *UNRECOVERED_JUMPTABLE;
  long lVar1;
  
  if (bp == (BIO *)0x0) {
    return 0;
  }
  if ((bp->method != (BIO_METHOD *)0x0) &&
     (UNRECOVERED_JUMPTABLE = bp->method->ctrl, UNRECOVERED_JUMPTABLE != (_func_599 *)0x0)) {
    lVar1 = (*UNRECOVERED_JUMPTABLE)(bp,cmd,larg,parg);
    return lVar1;
  }
  ERR_put_error(0x11,0,0x73,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/bio.cc"
                ,0xa9);
  return -2;
}

Assistant:

long BIO_ctrl(BIO *bio, int cmd, long larg, void *parg) {
  if (bio == NULL) {
    return 0;
  }

  if (bio->method == NULL || bio->method->ctrl == NULL) {
    OPENSSL_PUT_ERROR(BIO, BIO_R_UNSUPPORTED_METHOD);
    return -2;
  }

  return bio->method->ctrl(bio, cmd, larg, parg);
}